

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HArray.hpp
# Opt level: O3

Value<char16_t> * __thiscall
Qentem::HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::GetValue
          (HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *this,Char_T *key,SizeT length
          )

{
  Char_T *pCVar1;
  long lVar2;
  ulong uVar3;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *pHVar4;
  int iVar5;
  uint uVar6;
  SizeT hash;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  SizeT *index;
  SizeT *local_10;
  
  uVar3 = (ulong)length;
  if (length == 0) {
    hash = 0x8000000b;
  }
  else {
    uVar6 = 0xb;
    iVar5 = 0;
    uVar8 = 0;
    iVar9 = 0x21;
    do {
      pCVar1 = key + uVar8;
      iVar11 = iVar5 + iVar9;
      uVar7 = (uint)uVar8;
      iVar5 = iVar5 + 2;
      uVar10 = (uint)uVar3;
      uVar8 = uVar8 + 1;
      lVar2 = uVar3 - 1;
      uVar3 = uVar3 - 1;
      uVar6 = (uint)(ushort)key[lVar2] +
              (uVar10 ^ uVar7) * ((uint)(ushort)*pCVar1 * iVar9 * uVar7 + uVar6);
      iVar9 = iVar11;
    } while (uVar8 < uVar3);
    hash = uVar6 | 0x80000000;
  }
  if (((this->
       super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
       ).index_ != 0) &&
     (pHVar4 = HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
               ::find(&this->
                       super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                      ,&local_10,key,length,hash),
     pHVar4 != (HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)0x0)) {
    return &pHVar4->Value;
  }
  return (Value<char16_t> *)0x0;
}

Assistant:

Value_T *GetValue(const Char_T *key, const SizeT length) const noexcept {
        return GetValue(key, length, StringUtils::Hash(key, length));
    }